

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

char * readLine(redisReader *r,int *_len)

{
  int iVar1;
  char *pcVar2;
  int len;
  char *s;
  char *p;
  int *_len_local;
  redisReader *r_local;
  
  r_local = (redisReader *)(r->buf + r->pos);
  pcVar2 = seekNewline((char *)r_local,r->len - r->pos);
  if (pcVar2 == (char *)0x0) {
    r_local = (redisReader *)0x0;
  }
  else {
    iVar1 = (int)pcVar2 - ((int)r->buf + (int)r->pos);
    r->pos = (long)(iVar1 + 2) + r->pos;
    if (_len != (int *)0x0) {
      *_len = iVar1;
    }
  }
  return (char *)r_local;
}

Assistant:

static char *readLine(redisReader *r, int *_len) {
    char *p, *s;
    int len;

    p = r->buf+r->pos;
    s = seekNewline(p,(r->len-r->pos));
    if (s != NULL) {
        len = s-(r->buf+r->pos);
        r->pos += len+2; /* skip \r\n */
        if (_len) *_len = len;
        return p;
    }
    return NULL;
}